

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Chapters::WriteEdition(Chapters *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  uint64 uVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  long *in_RSI;
  IMkvWriter *in_RDI;
  int64_t stop;
  uint64_t chapter_size;
  Chapter *chapter_1;
  int idx_1;
  int64_t start;
  uint64_t edition_size;
  Chapter *chapter;
  int idx;
  uint64_t payload_size;
  uint64 in_stack_ffffffffffffffa0;
  IMkvWriter *in_stack_ffffffffffffffa8;
  int local_44;
  int local_24;
  long local_20;
  IMkvWriter *writer_00;
  Chapter *in_stack_fffffffffffffff8;
  
  local_20 = 0;
  writer_00 = in_RDI;
  for (local_24 = 0; local_24 < *(int *)((long)&in_RDI->_vptr_IMkvWriter + 4);
      local_24 = local_24 + 1) {
    uVar2 = Chapter::WriteAtom(in_stack_fffffffffffffff8,writer_00);
    local_20 = uVar2 + local_20;
  }
  uVar3 = EbmlMasterElementSize(in_stack_ffffffffffffffa0,(uint64)in_RDI);
  uVar2 = uVar3 + local_20;
  if (in_RSI != (long *)0x0) {
    lVar4 = (**(code **)(*in_RSI + 8))();
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(uint64)in_RDI);
    if (bVar1) {
      for (local_44 = 0; local_44 < *(int *)((long)&in_RDI->_vptr_IMkvWriter + 4);
          local_44 = local_44 + 1) {
        uVar5 = Chapter::WriteAtom(in_stack_fffffffffffffff8,writer_00);
        if (uVar5 == 0) {
          return 0;
        }
      }
      lVar6 = (**(code **)(*in_RSI + 8))();
      if ((lVar4 <= lVar6) && (lVar6 - lVar4 != uVar2)) {
        uVar2 = 0;
      }
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint64_t Chapters::WriteEdition(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];
    payload_size += chapter.WriteAtom(NULL);
  }

  const uint64_t edition_size =
      EbmlMasterElementSize(libwebm::kMkvEditionEntry, payload_size) +
      payload_size;

  if (writer == NULL)  // return size only
    return edition_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvEditionEntry, payload_size))
    return 0;  // error

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& chapter = chapters_[idx];

    const uint64_t chapter_size = chapter.WriteAtom(writer);
    if (chapter_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != edition_size)
    return 0;

  return edition_size;
}